

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# read.hpp
# Opt level: O3

void __thiscall
asio::detail::
read_dynbuf_op<asio::basic_stream_socket<asio::ip::tcp,_asio::stream_socket_service<asio::ip::tcp>_>,_asio::basic_streambuf_ref<std::allocator<char>_>,_asio::detail::transfer_exactly_t,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/catid[P]tonk/TonkineseNAT.cpp:1725:9)>
::operator()(read_dynbuf_op<asio::basic_stream_socket<asio::ip::tcp,_asio::stream_socket_service<asio::ip::tcp>_>,_asio::basic_streambuf_ref<std::allocator<char>_>,_asio::detail::transfer_exactly_t,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_catid[P]tonk_TonkineseNAT_cpp:1725:9)>
             *this,error_code *ec,size_t bytes_transferred,int start)

{
  state_type sVar1;
  basic_stream_socket<asio::ip::tcp,_asio::stream_socket_service<asio::ip::tcp>_> *pbVar2;
  HTTPRequester *pHVar3;
  reactive_socket_recv_op<asio::mutable_buffers_1,_asio::detail::read_dynbuf_op<asio::basic_stream_socket<asio::ip::tcp,_asio::stream_socket_service<asio::ip::tcp>_>,_asio::basic_streambuf_ref<std::allocator<char>_>,_asio::detail::transfer_exactly_t,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_catid[P]tonk_TonkineseNAT_cpp:1725:9)>_>
  *op;
  error_category *peVar4;
  ErrorResult *pEVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  thread_info_base *this_thread;
  int iVar10;
  ulong uVar11;
  basic_streambuf<std::allocator<char>_> *this_00;
  long in_FS_OFFSET;
  Result result;
  Result local_78;
  socket_type local_70;
  uint local_6c;
  ptr local_68;
  void *local_48;
  reactive_socket_service_base *local_40;
  base_implementation_type *local_38;
  
  this->start_ = start;
  uVar9 = this->total_transferred_;
  if (start == 1) {
    if ((ec->_M_value == 0) &&
       (uVar11 = (this->super_base_from_completion_cond<asio::detail::transfer_exactly_t>).
                 completion_condition_.size_, uVar6 = uVar11 - uVar9, uVar9 <= uVar11 && uVar6 != 0)
       ) {
      uVar9 = 0x10000;
      if (uVar6 < 0x10000) {
        uVar9 = uVar6;
      }
    }
    else {
      uVar9 = 0;
    }
    this_00 = (this->buffers_).sb_;
    lVar8 = *(long *)&this_00->field_0x28 - *(long *)&this_00->field_0x10;
    uVar6 = this_00->max_size_ - lVar8;
    uVar7 = (long)(this_00->buffer_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage -
            (long)((this_00->buffer_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_start + lVar8);
    if (uVar9 <= uVar6) {
      uVar6 = uVar9;
    }
    uVar11 = 0x200;
    if (0x200 < uVar7) {
      uVar11 = uVar7;
    }
    if (uVar6 < uVar11) {
      uVar11 = uVar6;
    }
  }
  else {
    uVar9 = uVar9 + bytes_transferred;
    this->total_transferred_ = uVar9;
    this_00 = (this->buffers_).sb_;
    lVar8 = *(long *)&this_00->field_0x28;
    iVar10 = (int)*(ulong *)&this_00->field_0x30 - (int)lVar8;
    if (lVar8 + bytes_transferred <= *(ulong *)&this_00->field_0x30) {
      iVar10 = (int)bytes_transferred;
    }
    lVar8 = iVar10 + lVar8;
    *(long *)&this_00->field_0x28 = lVar8;
    *(long *)&this_00->field_0x18 = lVar8;
    iVar10 = ec->_M_value;
    if ((iVar10 == 0) &&
       (uVar11 = (this->super_base_from_completion_cond<asio::detail::transfer_exactly_t>).
                 completion_condition_.size_, uVar6 = uVar11 - uVar9, uVar9 <= uVar11 && uVar6 != 0)
       ) {
      uVar11 = 0x10000;
      if (uVar6 < 0x10000) {
        uVar11 = uVar6;
      }
    }
    else {
      uVar11 = 0;
    }
    lVar8 = lVar8 - *(long *)&this_00->field_0x10;
    uVar6 = this_00->max_size_ - lVar8;
    uVar7 = (long)(this_00->buffer_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage -
            (long)((this_00->buffer_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_start + lVar8);
    if (uVar11 <= uVar6) {
      uVar6 = uVar11;
    }
    uVar11 = 0x200;
    if (0x200 < uVar7) {
      uVar11 = uVar7;
    }
    if (uVar6 < uVar11) {
      uVar11 = uVar6;
    }
    if ((bytes_transferred == 0 && iVar10 == 0) || (uVar6 == 0)) {
      pHVar3 = (this->handler_).this;
      pHVar3->AsyncRefs = pHVar3->AsyncRefs + -1;
      if (uVar9 == 0 || iVar10 != 0) {
        (**(code **)(*(long *)ec->_M_cat + 0x20))(&local_68,ec->_M_cat,iVar10);
        iVar10 = ec->_M_value;
        pEVar5 = (ErrorResult *)operator_new(0x38);
        pEVar5->Source = "Connection closed";
        (pEVar5->Description)._M_dataplus._M_p = (pointer)&(pEVar5->Description).field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&pEVar5->Description,local_68.h,
                   (undefined1 *)
                   ((long)&((local_68.h)->
                           super_base_from_completion_cond<asio::detail::transfer_exactly_t>).
                           completion_condition_.size_ +
                   (long)&((local_68.v)->super_reactive_socket_recv_op_base<asio::mutable_buffers_1>
                          ).super_reactor_op.super_operation));
        pEVar5->Type = Asio;
        pEVar5->Code = (long)iVar10;
        local_78.Error = pEVar5;
        if (local_68.h !=
            (read_dynbuf_op<asio::basic_stream_socket<asio::ip::tcp,_asio::stream_socket_service<asio::ip::tcp>_>,_asio::basic_streambuf_ref<std::allocator<char>_>,_asio::detail::transfer_exactly_t,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_catid[P]tonk_TonkineseNAT_cpp:1725:9)>
             *)&local_68.p) {
          operator_delete(local_68.h);
        }
        tonk::gateway::HTTPRequester::OnDone(pHVar3,&local_78,0,(char *)0x0,0);
        tonk::Result::~Result(&local_78);
        return;
      }
      tonk::gateway::HTTPRequester::ContinueReadingBody(pHVar3);
      return;
    }
  }
  pbVar2 = this->stream_;
  basic_streambuf<std::allocator<char>_>::reserve(this_00,uVar11);
  local_48 = *(void **)&this_00->field_0x28;
  local_38 = &(pbVar2->
              super_basic_socket<asio::ip::tcp,_asio::stream_socket_service<asio::ip::tcp>_>).
              super_basic_io_object<asio::stream_socket_service<asio::ip::tcp>,_true>.
              implementation_.super_base_implementation_type;
  local_40 = &(((pbVar2->
                super_basic_socket<asio::ip::tcp,_asio::stream_socket_service<asio::ip::tcp>_>).
                super_basic_io_object<asio::stream_socket_service<asio::ip::tcp>,_true>.service_)->
              service_impl_).super_reactive_socket_service_base;
  if (*(long *)(in_FS_OFFSET + -0x10) == 0) {
    this_thread = (thread_info_base *)0x0;
  }
  else {
    this_thread = *(thread_info_base **)(*(long *)(in_FS_OFFSET + -0x10) + 8);
  }
  local_6c = (uint)(this->start_ == 0);
  local_68.h = this;
  op = (reactive_socket_recv_op<asio::mutable_buffers_1,_asio::detail::read_dynbuf_op<asio::basic_stream_socket<asio::ip::tcp,_asio::stream_socket_service<asio::ip::tcp>_>,_asio::basic_streambuf_ref<std::allocator<char>_>,_asio::detail::transfer_exactly_t,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_catid[P]tonk_TonkineseNAT_cpp:1725:9)>_>
        *)thread_info_base::allocate(this_thread,0x88);
  local_70 = (pbVar2->super_basic_socket<asio::ip::tcp,_asio::stream_socket_service<asio::ip::tcp>_>
             ).super_basic_io_object<asio::stream_socket_service<asio::ip::tcp>,_true>.
             implementation_.super_base_implementation_type.socket_;
  sVar1 = (pbVar2->super_basic_socket<asio::ip::tcp,_asio::stream_socket_service<asio::ip::tcp>_>).
          super_basic_io_object<asio::stream_socket_service<asio::ip::tcp>,_true>.implementation_.
          super_base_implementation_type.state_;
  (op->super_reactive_socket_recv_op_base<asio::mutable_buffers_1>).super_reactor_op.super_operation
  .next_ = (scheduler_operation *)0x0;
  (op->super_reactive_socket_recv_op_base<asio::mutable_buffers_1>).super_reactor_op.super_operation
  .func_ = reactive_socket_recv_op<asio::mutable_buffers_1,_asio::detail::read_dynbuf_op<asio::basic_stream_socket<asio::ip::tcp,_asio::stream_socket_service<asio::ip::tcp>_>,_asio::basic_streambuf_ref<std::allocator<char>_>,_asio::detail::transfer_exactly_t,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/catid[P]tonk/TonkineseNAT.cpp:1725:9)>_>
           ::do_complete;
  (op->super_reactive_socket_recv_op_base<asio::mutable_buffers_1>).super_reactor_op.super_operation
  .task_result_ = 0;
  (op->super_reactive_socket_recv_op_base<asio::mutable_buffers_1>).super_reactor_op.ec_._M_value =
       0;
  local_68.v = op;
  peVar4 = (error_category *)std::_V2::system_category();
  (op->super_reactive_socket_recv_op_base<asio::mutable_buffers_1>).super_reactor_op.ec_._M_cat =
       peVar4;
  (op->super_reactive_socket_recv_op_base<asio::mutable_buffers_1>).super_reactor_op.
  bytes_transferred_ = 0;
  (op->super_reactive_socket_recv_op_base<asio::mutable_buffers_1>).super_reactor_op.perform_func_ =
       reactive_socket_recv_op_base<asio::mutable_buffers_1>::do_perform;
  (op->super_reactive_socket_recv_op_base<asio::mutable_buffers_1>).socket_ = local_70;
  (op->super_reactive_socket_recv_op_base<asio::mutable_buffers_1>).state_ = sVar1;
  (op->super_reactive_socket_recv_op_base<asio::mutable_buffers_1>).buffers_.super_mutable_buffer.
  data_ = local_48;
  (op->super_reactive_socket_recv_op_base<asio::mutable_buffers_1>).buffers_.super_mutable_buffer.
  size_ = uVar11;
  (op->super_reactive_socket_recv_op_base<asio::mutable_buffers_1>).flags_ = 0;
  (op->handler_).super_base_from_completion_cond<asio::detail::transfer_exactly_t>.
  completion_condition_.size_ =
       (this->super_base_from_completion_cond<asio::detail::transfer_exactly_t>).
       completion_condition_.size_;
  (op->handler_).stream_ = this->stream_;
  (op->handler_).buffers_.sb_ = (this->buffers_).sb_;
  (op->handler_).start_ = this->start_;
  pHVar3 = (this->handler_).this;
  (op->handler_).total_transferred_ = this->total_transferred_;
  (op->handler_).handler_.this = pHVar3;
  local_68.p = op;
  reactive_socket_service_base::start_op
            (local_40,local_38,0,(reactor_op *)op,SUB41(local_6c,0),true,
             (bool)(uVar11 == 0 &
                   ((pbVar2->
                    super_basic_socket<asio::ip::tcp,_asio::stream_socket_service<asio::ip::tcp>_>).
                    super_basic_io_object<asio::stream_socket_service<asio::ip::tcp>,_true>.
                    implementation_.super_base_implementation_type.state_ & 0x10) >> 4));
  local_68.v = (reactive_socket_recv_op<asio::mutable_buffers_1,_asio::detail::read_dynbuf_op<asio::basic_stream_socket<asio::ip::tcp,_asio::stream_socket_service<asio::ip::tcp>_>,_asio::basic_streambuf_ref<std::allocator<char>_>,_asio::detail::transfer_exactly_t,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_catid[P]tonk_TonkineseNAT_cpp:1725:9)>_>
                *)0x0;
  local_68.p = (reactive_socket_recv_op<asio::mutable_buffers_1,_asio::detail::read_dynbuf_op<asio::basic_stream_socket<asio::ip::tcp,_asio::stream_socket_service<asio::ip::tcp>_>,_asio::basic_streambuf_ref<std::allocator<char>_>,_asio::detail::transfer_exactly_t,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_catid[P]tonk_TonkineseNAT_cpp:1725:9)>_>
                *)0x0;
  reactive_socket_recv_op<asio::mutable_buffers_1,_asio::detail::read_dynbuf_op<asio::basic_stream_socket<asio::ip::tcp,_asio::stream_socket_service<asio::ip::tcp>_>,_asio::basic_streambuf_ref<std::allocator<char>_>,_asio::detail::transfer_exactly_t,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/catid[P]tonk/TonkineseNAT.cpp:1725:9)>_>
  ::ptr::reset(&local_68);
  return;
}

Assistant:

void operator()(const asio::error_code& ec,
        std::size_t bytes_transferred, int start = 0)
    {
      std::size_t max_size, bytes_available;
      switch (start_ = start)
      {
        case 1:
        max_size = this->check_for_completion(ec, total_transferred_);
        bytes_available = std::min<std::size_t>(
              std::max<std::size_t>(512,
                buffers_.capacity() - buffers_.size()),
              std::min<std::size_t>(max_size,
                buffers_.max_size() - buffers_.size()));
        for (;;)
        {
          stream_.async_read_some(buffers_.prepare(bytes_available),
              ASIO_MOVE_CAST(read_dynbuf_op)(*this));
          return; default:
          total_transferred_ += bytes_transferred;
          buffers_.commit(bytes_transferred);
          max_size = this->check_for_completion(ec, total_transferred_);
          bytes_available = std::min<std::size_t>(
                std::max<std::size_t>(512,
                  buffers_.capacity() - buffers_.size()),
                std::min<std::size_t>(max_size,
                  buffers_.max_size() - buffers_.size()));
          if ((!ec && bytes_transferred == 0) || bytes_available == 0)
            break;
        }

        handler_(ec, static_cast<const std::size_t&>(total_transferred_));
      }
    }